

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int lua_pcallk(lua_State *L,int nargs,int nresults,int errfunc,lua_KContext ctx,lua_KFunction k)

{
  CallInfo *pCVar1;
  int *piVar2;
  int iVar3;
  TValue *pTVar4;
  ptrdiff_t ef;
  CallS c;
  StkId local_40;
  int local_38;
  
  iVar3 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar3 + 1;
  if (iVar3 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x50f,"int lua_pcallk(lua_State *, int, int, int, lua_KContext, lua_KFunction)");
  }
  pCVar1 = L->ci;
  if ((k != (lua_KFunction)0x0) && ((pCVar1->callstatus & 2) != 0)) {
    __assert_fail("(k == ((void*)0) || !((L->ci)->callstatus & (1<<1))) && \"cannot use continuations inside hooks\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x511,"int lua_pcallk(lua_State *, int, int, int, lua_KContext, lua_KFunction)");
  }
  local_40 = L->top;
  if ((long)local_40 - (long)pCVar1->func >> 4 <= (long)(nargs + 1)) {
    __assert_fail("((nargs+1) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x512,"int lua_pcallk(lua_State *, int, int, int, lua_KContext, lua_KFunction)");
  }
  if (L->status == '\0') {
    if ((nresults != -1) && ((long)pCVar1->top - (long)local_40 >> 4 < (long)(nresults - nargs))) {
      __assert_fail("((nresults) == (-1) || (L->ci->top - L->top >= (nresults) - (nargs))) && \"results from function overflow current stack size\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x514,"int lua_pcallk(lua_State *, int, int, int, lua_KContext, lua_KFunction)"
                   );
    }
    if (errfunc == 0) {
      ef = 0;
    }
    else {
      pTVar4 = index2addr(L,errfunc);
      if ((errfunc < -0xf4627) || (pTVar4 == &luaO_nilobject_)) {
        __assert_fail("((((o) != (&luaO_nilobject_)) && !((errfunc) <= (-1000000 - 1000)))) && \"index not in the stack\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x519,
                      "int lua_pcallk(lua_State *, int, int, int, lua_KContext, lua_KFunction)");
      }
      ef = (long)pTVar4 - (long)L->stack;
      local_40 = L->top;
    }
    local_40 = local_40 + -(long)(nargs + 1);
    if ((k == (lua_KFunction)0x0) || (L->nny != 0)) {
      local_38 = nresults;
      iVar3 = luaD_pcall(L,f_call,&local_40,(long)local_40 - (long)L->stack,ef);
    }
    else {
      pCVar1 = L->ci;
      (pCVar1->u).c.k = k;
      (pCVar1->u).c.ctx = ctx;
      pCVar1->extra = (long)local_40 - (long)L->stack;
      (pCVar1->u).l.savedpc = (Instruction *)L->errfunc;
      L->errfunc = ef;
      pCVar1->callstatus = (ushort)L->allowhook | pCVar1->callstatus & 0xffee | 0x10;
      luaD_call(L,local_40,nresults);
      *(byte *)&pCVar1->callstatus = (byte)pCVar1->callstatus & 0xef;
      L->errfunc = (ptrdiff_t)(pCVar1->u).l.savedpc;
      iVar3 = 0;
    }
    if (nresults == -1) {
      if (L->ci->top < L->top) {
        L->ci->top = L->top;
      }
    }
    piVar2 = *(int **)&L[-1].hookmask;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      return iVar3;
    }
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x531,"int lua_pcallk(lua_State *, int, int, int, lua_KContext, lua_KFunction)");
  }
  __assert_fail("(L->status == 0) && \"cannot do calls on non-normal thread\"",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x513,"int lua_pcallk(lua_State *, int, int, int, lua_KContext, lua_KFunction)");
}

Assistant:

LUA_API int lua_pcallk (lua_State *L, int nargs, int nresults, int errfunc,
                        lua_KContext ctx, lua_KFunction k) {
  struct CallS c;
  int status;
  ptrdiff_t func;
  lua_lock(L);
  api_check(L, k == NULL || !isLua(L->ci),
    "cannot use continuations inside hooks");
  api_checknelems(L, nargs+1);
  api_check(L, L->status == LUA_OK, "cannot do calls on non-normal thread");
  checkresults(L, nargs, nresults);
  if (errfunc == 0)
    func = 0;
  else {
    StkId o = index2addr(L, errfunc);
    api_checkstackindex(L, errfunc, o);
    func = savestack(L, o);
  }
  c.func = L->top - (nargs+1);  /* function to be called */
  if (k == NULL || L->nny > 0) {  /* no continuation or no yieldable? */
    c.nresults = nresults;  /* do a 'conventional' protected call */
    status = luaD_pcall(L, f_call, &c, savestack(L, c.func), func);
  }
  else {  /* prepare continuation (call is already protected by 'resume') */
    CallInfo *ci = L->ci;
    ci->u.c.k = k;  /* save continuation */
    ci->u.c.ctx = ctx;  /* save context */
    /* save information for error recovery */
    ci->extra = savestack(L, c.func);
    ci->u.c.old_errfunc = L->errfunc;
    L->errfunc = func;
    setoah(ci->callstatus, L->allowhook);  /* save value of 'allowhook' */
    ci->callstatus |= CIST_YPCALL;  /* function can do error recovery */
    luaD_call(L, c.func, nresults);  /* do the call */
    ci->callstatus &= ~CIST_YPCALL;
    L->errfunc = ci->u.c.old_errfunc;
    status = LUA_OK;  /* if it is here, there were no errors */
  }
  adjustresults(L, nresults);
  lua_unlock(L);
  return status;
}